

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O0

void free_by_fd(int fd)

{
  rpchook_t *__ptr;
  rpchook_t *lp;
  int fd_local;
  
  if (((-1 < fd) && (fd < 1000000)) && (__ptr = g_rpchook_socket_fd[fd], __ptr != (rpchook_t *)0x0))
  {
    g_rpchook_socket_fd[fd] = (rpchook_t *)0x0;
    free(__ptr);
  }
  return;
}

Assistant:

static inline void free_by_fd( int fd )
{
	if( fd > -1 && fd < (int)sizeof(g_rpchook_socket_fd) / (int)sizeof(g_rpchook_socket_fd[0]) )
	{
		rpchook_t *lp = g_rpchook_socket_fd[ fd ];
		if( lp )
		{
			g_rpchook_socket_fd[ fd ] = NULL;
			free(lp);	
		}
	}
	return;

}